

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

bool __thiscall cmFindPackageCommand::FindAppBundleConfig(cmFindPackageCommand *this)

{
  string *psVar1;
  bool bVar2;
  string *prefix_in;
  long lVar3;
  string *psVar4;
  
  prefix_in = (this->super_cmFindCommon).SearchPaths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->super_cmFindCommon).SearchPaths.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)psVar1 - (long)prefix_in >> 7;
  if (0 < lVar3) {
    lVar3 = lVar3 + 1;
    do {
      bVar2 = SearchAppBundlePrefix(this,prefix_in);
      psVar4 = prefix_in;
      if (bVar2) goto LAB_002fd5f2;
      bVar2 = SearchAppBundlePrefix(this,prefix_in + 1);
      psVar4 = prefix_in + 1;
      if (bVar2) goto LAB_002fd5f2;
      bVar2 = SearchAppBundlePrefix(this,prefix_in + 2);
      psVar4 = prefix_in + 2;
      if (bVar2) goto LAB_002fd5f2;
      bVar2 = SearchAppBundlePrefix(this,prefix_in + 3);
      psVar4 = prefix_in + 3;
      if (bVar2) goto LAB_002fd5f2;
      prefix_in = prefix_in + 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)psVar1 - (long)prefix_in >> 5;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      psVar4 = psVar1;
      if ((lVar3 != 3) || (bVar2 = SearchAppBundlePrefix(this,prefix_in), psVar4 = prefix_in, bVar2)
         ) goto LAB_002fd5f2;
      prefix_in = prefix_in + 1;
    }
    bVar2 = SearchAppBundlePrefix(this,prefix_in);
    psVar4 = prefix_in;
    if (bVar2) goto LAB_002fd5f2;
    prefix_in = prefix_in + 1;
  }
  bVar2 = SearchAppBundlePrefix(this,prefix_in);
  psVar4 = prefix_in;
  if (!bVar2) {
    psVar4 = psVar1;
  }
LAB_002fd5f2:
  return psVar4 != psVar1;
}

Assistant:

bool cmFindPackageCommand::FindAppBundleConfig()
{
  std::vector<std::string> const& prefixes = this->SearchPaths;
  return std::any_of(prefixes.begin(), prefixes.end(),
                     [this](std::string const& p) -> bool {
                       return this->SearchAppBundlePrefix(p);
                     });
}